

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O0

Light_EvalRes * embree::SpotLight_eval(Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_EvalRes *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float pdf;
  float angularAttenuation;
  Vec3fa vd;
  float t;
  float dp;
  Vec3fa vp;
  float cosAngle;
  SpotLight *self;
  Light_EvalRes *res;
  __m128 r;
  __m128 a_2;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_3;
  float local_c3c;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  long local_ba8;
  undefined8 *local_ba0;
  long local_b98;
  undefined8 *local_b70;
  undefined1 *local_b60;
  undefined4 local_a7c;
  undefined8 *local_a78;
  float local_8e8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  
  local_ba8 = in_RSI;
  local_ba0 = in_RCX;
  local_b98 = in_RDX;
  Light_EvalRes::Light_EvalRes(in_RDI);
  local_a78 = &local_bb8;
  local_a7c = 0;
  local_1d8 = 0;
  local_1e8 = 0;
  uStack_1e4 = 0;
  uStack_1e0 = 0;
  uStack_1dc = 0;
  local_bb8 = 0;
  uStack_bb0 = 0;
  local_b70 = &local_bb8;
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  local_b60 = &inf;
  fVar1 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar1;
  in_RDI->pdf = 0.0;
  if (0.0 < *(float *)(local_ba8 + 0x68)) {
    local_38 = (float)*local_ba0;
    fStack_34 = (float)((ulong)*local_ba0 >> 0x20);
    fStack_30 = (float)local_ba0[1];
    local_48 = (float)*(undefined8 *)(local_ba8 + 0x40);
    fStack_44 = (float)((ulong)*(undefined8 *)(local_ba8 + 0x40) >> 0x20);
    fStack_40 = (float)*(undefined8 *)(local_ba8 + 0x48);
    fVar1 = -(local_38 * local_48 + fStack_34 * fStack_44 + fStack_30 * fStack_40);
    if (*(float *)(local_ba8 + 0x60) <= fVar1 && fVar1 != *(float *)(local_ba8 + 0x60)) {
      local_198 = (float)*(undefined8 *)(local_b98 + 0x20);
      fStack_194 = (float)((ulong)*(undefined8 *)(local_b98 + 0x20) >> 0x20);
      fStack_190 = (float)*(undefined8 *)(local_b98 + 0x28);
      local_1a8 = (float)*(undefined8 *)(local_ba8 + 0x10);
      fStack_1a4 = (float)((ulong)*(undefined8 *)(local_ba8 + 0x10) >> 0x20);
      fStack_1a0 = (float)*(undefined8 *)(local_ba8 + 0x18);
      local_68 = (float)*(undefined8 *)(local_ba8 + 0x40);
      fStack_64 = (float)((ulong)*(undefined8 *)(local_ba8 + 0x40) >> 0x20);
      fStack_60 = (float)*(undefined8 *)(local_ba8 + 0x48);
      fVar2 = (local_198 - local_1a8) * local_68 + (fStack_194 - fStack_1a4) * fStack_64 +
              (fStack_190 - fStack_1a0) * fStack_60;
      if (0.0 < fVar2) {
        auVar6 = rcpss(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
        local_8e8 = auVar6._0_4_;
        fVar2 = fVar2 * local_8e8 * (2.0 - local_8e8 * fVar1);
        local_28 = (float)*local_ba0;
        fStack_24 = (float)((ulong)*local_ba0 >> 0x20);
        fStack_20 = (float)local_ba0[1];
        fVar3 = (local_198 - local_1a8) + fVar2 * local_28;
        fVar4 = (fStack_194 - fStack_1a4) + fVar2 * fStack_24;
        fVar5 = (fStack_190 - fStack_1a0) + fVar2 * fStack_20;
        if (fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5 <
            *(float *)(local_ba8 + 0x68) * *(float *)(local_ba8 + 0x68)) {
          local_c3c = (fVar1 - *(float *)(local_ba8 + 0x60)) * *(float *)(local_ba8 + 100);
          if (1.0 <= local_c3c) {
            local_c3c = 1.0;
          }
          fVar1 = *(float *)(local_ba8 + 0x6c) * fVar1;
          local_c3c = local_c3c * fVar1;
          local_98 = (float)*(undefined8 *)(local_ba8 + 0x50);
          fStack_94 = (float)((ulong)*(undefined8 *)(local_ba8 + 0x50) >> 0x20);
          fStack_90 = (float)*(undefined8 *)(local_ba8 + 0x58);
          fStack_8c = (float)((ulong)*(undefined8 *)(local_ba8 + 0x58) >> 0x20);
          *(ulong *)&(in_RDI->value).field_0 = CONCAT44(fStack_94 * local_c3c,local_98 * local_c3c);
          *(ulong *)((long)&(in_RDI->value).field_0 + 8) =
               CONCAT44(fStack_8c * local_c3c,fStack_90 * local_c3c);
          in_RDI->dist = fVar2;
          in_RDI->pdf = fVar1 * fVar2 * fVar2;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes SpotLight_eval(const Light* super,
                                                          const DifferentialGeometry& dg,
                                                          const Vec3fa& dir)
{
  const SpotLight* self = (SpotLight*)super;
  Light_EvalRes res;
  res.value = Vec3fa(0.0f);
  res.dist = inf;
  res.pdf = 0.0f;

  if (self->radius > 0.0f) {
    // intersect disk
    const float cosAngle = -dot(dir, self->frame.vz);
    if (cosAngle > self->cosAngleMax) { // inside illuminated cone?
      const Vec3fa vp = dg.P - self->position;
      const float dp = dot(vp, self->frame.vz);
      if (dp > 0.0f) { // in front of light?
        const float t = dp*rcp(cosAngle);
        const Vec3fa vd = vp + t * dir;
        if (dot(vd, vd) < sqr(self->radius)) { // inside disk?
          const float angularAttenuation = min((cosAngle - self->cosAngleMax) * self->cosAngleScale, 1.f);
          const float pdf = self->diskPdf * cosAngle;
          res.value = self->power * (angularAttenuation * pdf); // *sqr(t)/sqr(t) cancels
          res.dist = t;
          res.pdf = pdf * sqr(t);
        }
      }
    }
  }

  return res;
}